

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlspwin.c
# Opt level: O1

void DoRing(void)

{
  ushort uVar1;
  ushort uVar2;
  DLword *pDVar3;
  DLword DVar4;
  
  uVar1 = *EmKbdAd268K;
  if ((uVar1 & 0x841) == 0) {
    error("******  EMERGENCY Interrupt ******");
    *EmKbdAd268K = 0xffff;
  }
  else {
    if ((uVar1 & 0x842) != 0 && (uVar1 & 0x4840) != 0) goto LAB_0014140f;
    *EmKbdAd268K = 0xffff;
    URaid_req = 1;
  }
  CTopKeyevent[1] = 0;
  *CTopKeyevent = 2;
LAB_0014140f:
  pDVar3 = CTopKeyevent;
  uVar1 = *CTopKeyevent;
  uVar2 = CTopKeyevent[1];
  if (uVar2 != uVar1) {
    CTopKeyevent[(ulong)uVar1 + 1] = *EmKbdAd068K;
    pDVar3[uVar1] = *EmKbdAd168K;
    pDVar3[(ulong)uVar1 + 3] = *EmKbdAd268K;
    pDVar3[(ulong)uVar1 + 2] = *EmKbdAd368K;
    pDVar3[(ulong)uVar1 + 4] = *EmKbdAd468K;
    pDVar3[(ulong)uVar1 + 7] = *EmKbdAd568K;
    pDVar3[(ulong)uVar1 + 5] = *EmRealUtilin68K;
    if (uVar2 == 0) {
      CTopKeyevent[1] = uVar1;
    }
    DVar4 = 2;
    if (uVar1 < 0x14f4) {
      DVar4 = uVar1 + 0xe;
    }
    *CTopKeyevent = DVar4;
  }
  if (*KEYBUFFERING68k == 0) {
    *KEYBUFFERING68k = 0x4c;
  }
  return;
}

Assistant:

void DoRing(void) {
  DLword w, r;
  KBEVENT *kbevent;

  TPRINT(("TRACE: DoRing()\n"));
do_ring:
  /* DEL is not generally present on a Mac X keyboard, Ctrl-shift-ESC would be 18496 */
  if (((*EmKbdAd268K) & 2113) == 0) { /*Ctrl-shift-NEXT*/
    error("******  EMERGENCY Interrupt ******");
    *EmKbdAd268K = KB_ALLUP;          /*reset*/
    ((RING *)CTopKeyevent)->read = 0; /* reset queue */
    ((RING *)CTopKeyevent)->write = MINKEYEVENT;
    /*return(0);*/
  } else if (((*EmKbdAd268K) & 2114) == 0 || ((*EmKbdAd268K) & 18496) == 0) { /* Ctrl-Shift-DEL */
    *EmKbdAd268K = KB_ALLUP;                 /*reset*/
    URaid_req = T;
    ((RING *)CTopKeyevent)->read = 0; /* reset queue */
    ((RING *)CTopKeyevent)->write = MINKEYEVENT;
    /*return(0);*/
  }

#ifdef OS4_TYPE4BUG
  else if (((*EmKbdAd268K) & 2120) == 0) { /* Ctrl-Shift-Return */
    *EmKbdAd268K = KB_ALLUP;               /*reset*/
    URaid_req = T;
    ((RING *)CTopKeyevent)->read = 0; /* reset queue */
    ((RING *)CTopKeyevent)->write = MINKEYEVENT;
  }
#endif

  r = RING_READ(CTopKeyevent);
  w = RING_WRITE(CTopKeyevent);

  if (r == w) /* event queue FULL */
    goto KBnext;

  kbevent = (KBEVENT *)(CTopKeyevent + w);
  /*    RCLK(kbevent->time); */
  kbevent->W0 = *EmKbdAd068K;
  kbevent->W1 = *EmKbdAd168K;
  kbevent->W2 = *EmKbdAd268K;
  kbevent->W3 = *EmKbdAd368K;
  kbevent->W4 = *EmKbdAd468K;
  kbevent->W5 = *EmKbdAd568K;
  kbevent->WU = *EmRealUtilin68K;

  if (r == 0) /* Queue was empty */
    ((RING *)CTopKeyevent)->read = w;
  if (w >= MAXKEYEVENT)
    ((RING *)CTopKeyevent)->write = MINKEYEVENT;
  else
    ((RING *)CTopKeyevent)->write = w + KEYEVENTSIZE;

KBnext:
  if (*KEYBUFFERING68k == NIL) *KEYBUFFERING68k = ATOM_T;
}